

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
spvtools::opt::AggressiveDCEPass::GetLoadedVariablesFromFunctionCall
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          AggressiveDCEPass *this,Instruction *inst)

{
  Instruction *this_00;
  Op OVar1;
  anon_class_16_2_edeabadf local_58;
  function<void_(const_unsigned_int_*)> local_48;
  undefined1 local_21;
  Instruction *local_20;
  Instruction *inst_local;
  AggressiveDCEPass *this_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *live_variables;
  
  local_20 = inst;
  inst_local = (Instruction *)this;
  this_local = (AggressiveDCEPass *)__return_storage_ptr__;
  OVar1 = opt::Instruction::opcode(inst);
  if (OVar1 != OpFunctionCall) {
    __assert_fail("inst->opcode() == spv::Op::OpFunctionCall",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp"
                  ,0x1d3,
                  "std::vector<uint32_t> spvtools::opt::AggressiveDCEPass::GetLoadedVariablesFromFunctionCall(const Instruction *)"
                 );
  }
  local_21 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  this_00 = local_20;
  local_58.this = this;
  local_58.live_variables = __return_storage_ptr__;
  std::function<void(unsigned_int_const*)>::
  function<spvtools::opt::AggressiveDCEPass::GetLoadedVariablesFromFunctionCall(spvtools::opt::Instruction_const*)::__0,void>
            ((function<void(unsigned_int_const*)> *)&local_48,&local_58);
  opt::Instruction::ForEachInId(this_00,&local_48);
  std::function<void_(const_unsigned_int_*)>::~function(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> AggressiveDCEPass::GetLoadedVariablesFromFunctionCall(
    const Instruction* inst) {
  assert(inst->opcode() == spv::Op::OpFunctionCall);
  std::vector<uint32_t> live_variables;
  // NOTE: we should only be checking function call parameters here, not the
  // function itself, however, `IsPtr` will trivially return false for
  // OpFunction
  inst->ForEachInId([this, &live_variables](const uint32_t* operand_id) {
    if (!IsPtr(*operand_id)) return;
    uint32_t var_id = GetVariableId(*operand_id);
    live_variables.push_back(var_id);
  });
  return live_variables;
}